

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::WallyUtil::ConvertEntropyToMnemonic
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,ByteData *entropy,string *language)

{
  words *w;
  CfdException *this;
  char *wally_string;
  allocator local_8d;
  int ret;
  string mnemonic_sentence;
  char *mnemonic_bytes;
  string local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  
  w = Bip39GetWordlist(language);
  ByteData::GetBytes(&entropy_bytes,entropy);
  mnemonic_bytes = (char *)0x0;
  ret = bip39_mnemonic_from_bytes
                  (w,entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (long)entropy_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)entropy_bytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&mnemonic_bytes);
  if (ret == 0) {
    ConvertStringAndFree_abi_cxx11_(&mnemonic_sentence,(WallyUtil *)mnemonic_bytes,wally_string);
    ::std::__cxx11::string::string((string *)&local_60," ",&local_8d);
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__return_storage_ptr__,(string *)&mnemonic_sentence,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&mnemonic_sentence);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  mnemonic_sentence._M_dataplus._M_p = "cfdcore_wally_util.cpp";
  mnemonic_sentence._M_string_length._0_4_ = 0xef;
  mnemonic_sentence.field_2._M_allocated_capacity = (long)"CfdConvertEntropyToMnemonic" + 3;
  logger::warn<int&>((CfdSourceLocation *)&mnemonic_sentence,
                     "Convert entropy to mnemonic error. ret=[{}]",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&mnemonic_sentence,"Convert entropy to mnemonic error.",
             (allocator *)&local_60);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&mnemonic_sentence);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> WallyUtil::ConvertEntropyToMnemonic(
    const ByteData& entropy, const std::string& language) {
  words* wally_wordlist = Bip39GetWordlist(language);

  std::vector<uint8_t> entropy_bytes = entropy.GetBytes();
  char* mnemonic_bytes = NULL;
  int ret = bip39_mnemonic_from_bytes(
      wally_wordlist, entropy_bytes.data(), entropy_bytes.size(),
      &mnemonic_bytes);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert entropy to mnemonic error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Convert entropy to mnemonic error.");
  }

  std::string mnemonic_sentence =
      WallyUtil::ConvertStringAndFree(mnemonic_bytes);
  std::vector<std::string> mnemonic =
      StringUtil::Split(mnemonic_sentence, kMnemonicDelimiter);

  return mnemonic;
}